

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  ImGuiWindow *window_00;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != window) {
    GImGui->NavWindow = window;
    IVar2 = 0;
    if (window != (ImGuiWindow *)0x0) {
      if (pIVar1->NavDisableMouseHover == true) {
        pIVar1->NavMousePosDirty = true;
      }
      IVar2 = window->NavLastIds[0];
    }
    pIVar1->NavId = IVar2;
    pIVar1->NavFocusScopeId = 0;
    pIVar1->NavIdIsAlive = false;
    pIVar1->NavLayer = ImGuiNavLayer_Main;
    pIVar1->NavMoveSubmitted = false;
    pIVar1->NavMoveScoringItems = false;
    pIVar1->NavAnyRequest = false;
    pIVar1->NavInitRequest = false;
  }
  window_00 = (ImGuiWindow *)0x0;
  ClosePopupsOverWindow(window,false);
  if (window != (ImGuiWindow *)0x0) {
    window_00 = window->RootWindow;
  }
  if ((((pIVar1->ActiveId != 0) && (pIVar1->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
      (pIVar1->ActiveIdWindow->RootWindow != window_00)) &&
     (pIVar1->ActiveIdNoClearOnFocusLoss == false)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  if (window != (ImGuiWindow *)0x0) {
    BringWindowToFocusFront(window_00);
    if (((uint)(window_00->Flags | window->Flags) >> 0xd & 1) == 0) {
      BringWindowToDisplayFront(window_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavFocusScopeId = 0;
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        g.NavInitRequest = g.NavMoveSubmitted = g.NavMoveScoringItems = false;
        NavUpdateAnyRequestFlag();
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}